

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcreteVisitor.hh
# Opt level: O0

shared_ptr<VisitorResult> __thiscall ConcreteVisitor::visit(ConcreteVisitor *this,ASTWhere *where)

{
  __shared_ptr_access<ASTOperation,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar1;
  ASTWhere *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<VisitorResult> sVar2;
  shared_ptr<LogicalFilter> local_50;
  shared_ptr<VisitorResult> local_40;
  undefined1 local_30 [8];
  shared_ptr<LogicalOperation> lop;
  ASTWhere *where_local;
  ConcreteVisitor *this_local;
  
  this_00 = (__shared_ptr_access<ASTOperation,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            ASTWhere::getFilterOperation(in_RDX);
  peVar1 = std::__shared_ptr_access<ASTOperation,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this_00);
  (**(peVar1->super_ASTNode)._vptr_ASTNode)(&local_40,peVar1,where);
  std::static_pointer_cast<LogicalOperation,VisitorResult>((shared_ptr<VisitorResult> *)local_30);
  std::shared_ptr<VisitorResult>::~shared_ptr(&local_40);
  std::make_shared<LogicalFilter,std::shared_ptr<LogicalOperation>&>
            ((shared_ptr<LogicalOperation> *)&local_50);
  std::shared_ptr<VisitorResult>::shared_ptr<LogicalFilter,void>
            ((shared_ptr<VisitorResult> *)this,&local_50);
  std::shared_ptr<LogicalFilter>::~shared_ptr(&local_50);
  std::shared_ptr<LogicalOperation>::~shared_ptr((shared_ptr<LogicalOperation> *)local_30);
  sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<VisitorResult>)
         sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VisitorResult> visit(ASTWhere *where) override {
        auto lop = std::static_pointer_cast<LogicalOperation>(where->getFilterOperation()->accept(this));
        return std::make_shared<LogicalFilter>(lop);
    }